

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmGhsMultiTargetGenerator::WriteObjectLangOverride_abi_cxx11_
          (string *__return_storage_ptr__,cmGhsMultiTargetGenerator *this,cmSourceFile *sourceFile)

{
  cmValue cVar1;
  cmAlphaNum local_90;
  string local_60;
  cmAlphaNum local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"LANGUAGE",(allocator<char> *)&local_40);
  cVar1 = cmSourceFile::GetProperty((cmSourceFile *)this,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (cVar1.Value != (string *)0x0) {
    local_90.View_._M_len = 2;
    local_90.View_._M_str = " [";
    local_40.View_._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
    local_40.View_._M_len = (cVar1.Value)->_M_string_length;
    cmStrCat<char[2]>(&local_60,&local_90,&local_40,(char (*) [2])0x5c4ad9);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGhsMultiTargetGenerator::WriteObjectLangOverride(
  const cmSourceFile* sourceFile)
{
  std::string ret;
  cmValue rawLangProp = sourceFile->GetProperty("LANGUAGE");
  if (rawLangProp) {
    ret = cmStrCat(" [", *rawLangProp, "]");
  }

  return ret;
}